

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trw.h
# Opt level: O0

void __thiscall libDAI::TRW::TRW(TRW *this,TRW *x)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long in_RSI;
  undefined8 *in_RDI;
  vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *in_stack_00000008;
  vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *in_stack_00000010;
  WeightedGraph<double> *in_stack_ffffffffffffffb8;
  WeightedGraph<double> *this_00;
  DAIAlg<libDAI::FactorGraph> *in_stack_ffffffffffffffd8;
  DAIAlg<libDAI::FactorGraph> *in_stack_ffffffffffffffe0;
  
  DAIAlg<libDAI::FactorGraph>::DAIAlg(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  *in_RDI = &PTR_clone_00d4e770;
  uVar1 = *(undefined8 *)(in_RSI + 0x118);
  uVar2 = *(undefined8 *)(in_RSI + 0x120);
  uVar3 = *(undefined8 *)(in_RSI + 0x128);
  uVar4 = *(undefined8 *)(in_RSI + 0x130);
  uVar5 = *(undefined8 *)(in_RSI + 0x138);
  uVar6 = *(undefined8 *)(in_RSI + 0x140);
  uVar7 = *(undefined8 *)(in_RSI + 0x148);
  in_RDI[0x26] = *(undefined8 *)(in_RSI + 0x130);
  in_RDI[0x27] = uVar5;
  in_RDI[0x28] = uVar6;
  in_RDI[0x29] = uVar7;
  in_RDI[0x23] = uVar1;
  in_RDI[0x24] = uVar2;
  in_RDI[0x25] = uVar3;
  in_RDI[0x26] = uVar4;
  in_RDI[0x2a] = *(undefined8 *)(in_RSI + 0x150);
  in_RDI[0x2b] = *(undefined8 *)(in_RSI + 0x158);
  std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::vector
            (in_stack_00000010,in_stack_00000008);
  std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::vector
            (in_stack_00000010,in_stack_00000008);
  this_00 = (WeightedGraph<double> *)(in_RDI + 0x32);
  WeightedGraph<double>::WeightedGraph(this_00,in_stack_ffffffffffffffb8);
  WeightedGraph<double>::WeightedGraph(this_00,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

TRW & operator=( const TRW & x ) {
                if( this != &x ) {
                    DAIAlgFG::operator=( x );
                    Props          = x.Props;
                    _maxdiff       = x._maxdiff;
                    _iterations    = x._iterations;
                    _messages      = x._messages;
                    _newmessages   = x._newmessages;
                    _rho_e         = x._rho_e;
                    _rho_e_descent = x._rho_e_descent;
                }
                return *this;
            }